

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O0

void mzd_addmul_v_s256_30_256_idx(mzd_local_t *c,mzd_local_t *A,word idx)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 (*in_RSI) [32];
  ulong *in_RDI;
  undefined8 uVar8;
  size_t bit;
  undefined8 uVar9;
  word idx_00;
  undefined8 uVar10;
  undefined8 uVar11;
  uint i;
  word256 cval [2];
  block_t *Ablock;
  block_t *cblock;
  size_t in_stack_fffffffffffffa60;
  size_t bit_00;
  word in_stack_fffffffffffffa68;
  word idx_01;
  int local_424;
  ulong local_420;
  ulong uStack_418;
  ulong uStack_410;
  ulong uStack_408;
  undefined1 local_400 [32];
  undefined1 (*local_3c8) [32];
  ulong local_300;
  ulong uStack_2f8;
  ulong uStack_2f0;
  ulong uStack_2e8;
  ulong local_2c0;
  ulong uStack_2b8;
  ulong uStack_2b0;
  ulong uStack_2a8;
  ulong local_280;
  ulong uStack_278;
  ulong uStack_270;
  ulong uStack_268;
  ulong local_240;
  ulong uStack_238;
  ulong uStack_230;
  ulong uStack_228;
  ulong local_200;
  ulong uStack_1f8;
  ulong uStack_1f0;
  ulong uStack_1e8;
  
  local_420 = *in_RDI;
  uStack_418 = in_RDI[1];
  uStack_410 = in_RDI[2];
  uStack_408 = in_RDI[3];
  uVar8 = *(undefined8 *)*in_RSI;
  uVar9 = *(undefined8 *)(*in_RSI + 8);
  uVar10 = *(undefined8 *)(*in_RSI + 0x10);
  uVar11 = *(undefined8 *)(*in_RSI + 0x18);
  auVar1 = *in_RSI;
  mm256_compute_mask(in_stack_fffffffffffffa68,in_stack_fffffffffffffa60);
  auVar7._8_8_ = uVar9;
  auVar7._0_8_ = uVar8;
  auVar7._16_8_ = uVar10;
  auVar7._24_8_ = uVar11;
  auVar1 = vpand_avx2(auVar1,auVar7);
  local_200 = auVar1._0_8_;
  uStack_1f8 = auVar1._8_8_;
  uStack_1f0 = auVar1._16_8_;
  uStack_1e8 = auVar1._24_8_;
  local_420 = local_420 ^ local_200;
  uStack_418 = uStack_418 ^ uStack_1f8;
  uStack_410 = uStack_410 ^ uStack_1f0;
  uStack_408 = uStack_408 ^ uStack_1e8;
  uVar8 = *(undefined8 *)in_RSI[1];
  uVar9 = *(undefined8 *)(in_RSI[1] + 8);
  uVar10 = *(undefined8 *)(in_RSI[1] + 0x10);
  uVar11 = *(undefined8 *)(in_RSI[1] + 0x18);
  auVar7 = in_RSI[1];
  mm256_compute_mask(in_stack_fffffffffffffa68,in_stack_fffffffffffffa60);
  auVar1._8_8_ = uVar9;
  auVar1._0_8_ = uVar8;
  auVar1._16_8_ = uVar10;
  auVar1._24_8_ = uVar11;
  local_400 = vpand_avx2(auVar7,auVar1);
  local_3c8 = in_RSI + 2;
  for (local_424 = 0x1c; local_424 != 0; local_424 = local_424 + -4) {
    bit = *(size_t *)*local_3c8;
    idx_00 = *(word *)(*local_3c8 + 8);
    uVar8 = *(undefined8 *)(*local_3c8 + 0x10);
    uVar9 = *(undefined8 *)(*local_3c8 + 0x18);
    uVar10 = uVar8;
    uVar11 = uVar9;
    bit_00 = bit;
    idx_01 = idx_00;
    mm256_compute_mask(idx_00,bit);
    auVar6._8_8_ = idx_01;
    auVar6._0_8_ = bit_00;
    auVar6._16_8_ = uVar8;
    auVar6._24_8_ = uVar9;
    auVar5._8_8_ = idx_00;
    auVar5._0_8_ = bit;
    auVar5._16_8_ = uVar10;
    auVar5._24_8_ = uVar11;
    auVar1 = vpand_avx2(auVar6,auVar5);
    local_240 = auVar1._0_8_;
    uStack_238 = auVar1._8_8_;
    uStack_230 = auVar1._16_8_;
    uStack_228 = auVar1._24_8_;
    uVar8 = *(undefined8 *)local_3c8[1];
    uVar9 = *(undefined8 *)(local_3c8[1] + 8);
    uVar10 = *(undefined8 *)(local_3c8[1] + 0x10);
    uVar11 = *(undefined8 *)(local_3c8[1] + 0x18);
    auVar1 = local_3c8[1];
    mm256_compute_mask(idx_01,bit_00);
    auVar4._8_8_ = uVar9;
    auVar4._0_8_ = uVar8;
    auVar4._16_8_ = uVar10;
    auVar4._24_8_ = uVar11;
    auVar1 = vpand_avx2(auVar1,auVar4);
    local_280 = auVar1._0_8_;
    uStack_278 = auVar1._8_8_;
    uStack_270 = auVar1._16_8_;
    uStack_268 = auVar1._24_8_;
    uVar8 = *(undefined8 *)local_3c8[2];
    uVar9 = *(undefined8 *)(local_3c8[2] + 8);
    uVar10 = *(undefined8 *)(local_3c8[2] + 0x10);
    uVar11 = *(undefined8 *)(local_3c8[2] + 0x18);
    auVar1 = local_3c8[2];
    mm256_compute_mask(idx_01,bit_00);
    auVar3._8_8_ = uVar9;
    auVar3._0_8_ = uVar8;
    auVar3._16_8_ = uVar10;
    auVar3._24_8_ = uVar11;
    auVar1 = vpand_avx2(auVar1,auVar3);
    local_2c0 = auVar1._0_8_;
    uStack_2b8 = auVar1._8_8_;
    uStack_2b0 = auVar1._16_8_;
    uStack_2a8 = auVar1._24_8_;
    local_420 = local_420 ^ local_240 ^ local_2c0;
    uStack_418 = uStack_418 ^ uStack_238 ^ uStack_2b8;
    uStack_410 = uStack_410 ^ uStack_230 ^ uStack_2b0;
    uStack_408 = uStack_408 ^ uStack_228 ^ uStack_2a8;
    uVar8 = *(undefined8 *)local_3c8[3];
    uVar9 = *(undefined8 *)(local_3c8[3] + 8);
    uVar10 = *(undefined8 *)(local_3c8[3] + 0x10);
    uVar11 = *(undefined8 *)(local_3c8[3] + 0x18);
    auVar1 = local_3c8[3];
    mm256_compute_mask(idx_01,bit_00);
    auVar2._8_8_ = uVar9;
    auVar2._0_8_ = uVar8;
    auVar2._16_8_ = uVar10;
    auVar2._24_8_ = uVar11;
    auVar1 = vpand_avx2(auVar1,auVar2);
    local_300 = auVar1._0_8_;
    uStack_2f8 = auVar1._8_8_;
    uStack_2f0 = auVar1._16_8_;
    uStack_2e8 = auVar1._24_8_;
    local_400._8_8_ = local_400._8_8_ ^ uStack_278 ^ uStack_2f8;
    local_400._0_8_ = local_400._0_8_ ^ local_280 ^ local_300;
    local_400._16_8_ = local_400._16_8_ ^ uStack_270 ^ uStack_2f0;
    local_400._24_8_ = local_400._24_8_ ^ uStack_268 ^ uStack_2e8;
    local_3c8 = local_3c8 + 4;
  }
  *in_RDI = local_420 ^ local_400._0_8_;
  in_RDI[1] = uStack_418 ^ local_400._8_8_;
  in_RDI[2] = uStack_410 ^ local_400._16_8_;
  in_RDI[3] = uStack_408 ^ local_400._24_8_;
  return;
}

Assistant:

ATTR_TARGET_AVX2
static inline void mzd_addmul_v_s256_30_256_idx(mzd_local_t* c, mzd_local_t const* A, word idx) {
  block_t* cblock       = BLOCK(c, 0);
  const block_t* Ablock = CONST_BLOCK(A, 0);

  word256 cval[2];
  cval[0] = mm256_xor_mask(mm256_load(cblock->w64), mm256_load(Ablock[0].w64),
                           mm256_compute_mask(idx, 0));
  cval[1] = mm256_and(mm256_load(Ablock[1].w64), mm256_compute_mask(idx, 1));
  idx >>= 2;
  Ablock += 2;

  for (unsigned int i = 28; i; i -= 4, idx >>= 4, Ablock += 4) {
    cval[0] = mm256_xor_mask(cval[0], mm256_load(Ablock[0].w64), mm256_compute_mask(idx, 0));
    cval[1] = mm256_xor_mask(cval[1], mm256_load(Ablock[1].w64), mm256_compute_mask(idx, 1));
    cval[0] = mm256_xor_mask(cval[0], mm256_load(Ablock[2].w64), mm256_compute_mask(idx, 2));
    cval[1] = mm256_xor_mask(cval[1], mm256_load(Ablock[3].w64), mm256_compute_mask(idx, 3));
  }
  mm256_store(cblock->w64, mm256_xor(cval[0], cval[1]));
}